

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var __thiscall Js::JavascriptString::ToInteger(JavascriptString *this,int radix)

{
  LPCOLESTR pStrEnd;
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  int32 iVar5;
  undefined4 *puVar6;
  char16 *pStr;
  CharClassifier *this_00;
  Var pvVar7;
  Type *pTVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  double value;
  undefined1 local_d8 [8];
  BigUInt bi;
  LPCOLESTR local_38;
  
  if (0x22 < radix - 2U && radix != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xb95,"(radix == 0 || radix >= 2 && radix <= 36)",
                                "\'radix\' is invalid");
    if (!bVar3) goto LAB_00bc25d8;
    *puVar6 = 0;
  }
  pStr = GetString(this);
  pStrEnd = pStr + this->m_charLength;
  this_00 = ScriptContext::GetCharClassifier
                      ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr);
  local_38 = CharClassifier::SkipWhiteSpace(this_00,pStr,pStrEnd);
  if (local_38 < pStrEnd) {
    bVar3 = false;
    bVar4 = false;
    if (*local_38 != L'+') {
      if (*local_38 != L'-') goto LAB_00bc2210;
      bVar4 = true;
    }
    bVar3 = bVar4;
    local_38 = local_38 + 1;
  }
  else {
    bVar3 = false;
  }
LAB_00bc2210:
  uVar9 = 0x10;
  if (radix == 0) {
    if ((((local_38 < pStrEnd) && (*local_38 != L'0')) || ((long)pStrEnd - (long)local_38 < 3)) ||
       ((OLECHAR)(local_38[1] | 0x20U) != 0x78)) {
      radix = 10;
    }
    else {
LAB_00bc22f8:
      local_38 = local_38 + 2;
      radix = uVar9;
    }
LAB_00bc2308:
    uVar10 = (ulong)(uint)radix;
  }
  else {
    if (radix == 0x10) {
      radix = uVar9;
      if (((2 < (long)pStrEnd - (long)local_38) && (*local_38 == L'0')) &&
         ((OLECHAR)(local_38[1] | 0x20U) == 0x78)) goto LAB_00bc22f8;
      goto LAB_00bc2308;
    }
    uVar10 = (ulong)radix;
    if (0x25 < (uint)radix) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xbc2,
                                  "(radix <= (sizeof(*__countof_helper(maxUintStringLengthTable)) + 0))"
                                  ,"radix <= _countof(maxUintStringLengthTable)");
      if (!bVar4) goto LAB_00bc25d8;
      *puVar6 = 0;
    }
  }
  if (pStrEnd < local_38) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xbc3,"(pchEnd >= pch)","pchEnd >= pch");
    if (!bVar4) {
LAB_00bc25d8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if ((ulong)(byte)maxUintStringLengthTable[uVar10] < (ulong)((long)pStrEnd - (long)local_38 >> 1))
  {
    BigUInt::BigUInt((BigUInt *)local_d8);
    lVar11 = 0;
    while ((((LPCOLESTR)((long)local_38 + lVar11) < pStrEnd &&
            (uVar10 = (ulong)(ushort)*(LPCOLESTR)((long)local_38 + lVar11), uVar10 < 0x80)) &&
           ((int)((int)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"[uVar10] & 0xffffU) < radix
           ))) {
      bVar4 = BigUInt::FMulAdd((BigUInt *)local_d8,radix,
                               (int)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"[uVar10] &
                               0xffffU);
      if (!bVar4) {
        JavascriptError::ThrowOutOfMemoryError
                  ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                   super_JavascriptLibraryBase).scriptContext.ptr);
      }
      iVar5 = BigUInt::Clu((BigUInt *)local_d8);
      if (0x20 < iVar5) {
        pJVar1 = (((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                   super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                 javascriptLibrary;
        if (bVar3) {
          pTVar8 = &(pJVar1->super_JavascriptLibraryBase).negativeInfinite;
        }
        else {
          pTVar8 = &(pJVar1->super_JavascriptLibraryBase).positiveInfinite;
        }
        goto LAB_00bc257a;
      }
      lVar11 = lVar11 + 2;
    }
    if (lVar11 == 0) {
      pTVar8 = &(((((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                    super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                 javascriptLibrary)->super_JavascriptLibraryBase).nan;
LAB_00bc257a:
      pvVar7 = pTVar8->ptr;
    }
    else {
      value = BigUInt::GetDbl((BigUInt *)local_d8);
      if (bVar3) {
        value = -value;
      }
      pvVar7 = JavascriptNumber::ToVarIntCheck
                         (value,(((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr
                                 )->super_JavascriptLibraryBase).scriptContext.ptr);
    }
    BigUInt::~BigUInt((BigUInt *)local_d8);
  }
  else {
    lVar11 = 0;
    bi.m_rgluInit._112_8_ = this;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    uVar9 = 0;
    while ((((LPCOLESTR)((long)local_38 + lVar11) < pStrEnd &&
            (uVar10 = (ulong)(ushort)*(LPCOLESTR)((long)local_38 + lVar11), uVar10 < 0x80)) &&
           ((int)((int)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"[uVar10] & 0xffffU) < radix
           ))) {
      uVar12 = ((int)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"[uVar10] & 0xffffU) +
               uVar9 * radix;
      if (uVar12 < uVar9) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0xbd5,"(value >= beforeValue)","uint overflow");
        if (!bVar4) goto LAB_00bc25d8;
        *puVar6 = 0;
      }
      lVar11 = lVar11 + 2;
      uVar9 = uVar12;
    }
    if (lVar11 == 0) {
      pvVar7 = *(Var *)(*(long *)(*(long *)(*(long *)(*(long *)(bi.m_rgluInit._112_8_ + 8) + 8) +
                                           0x490) + 8) + 0x3f8);
    }
    else {
      if (!bVar3) {
        pvVar7 = JavascriptNumber::ToVar
                           (uVar9,*(ScriptContext **)
                                   (*(long *)(*(long *)(bi.m_rgluInit._112_8_ + 8) + 8) + 0x490));
        return pvVar7;
      }
      if ((int)uVar9 < 1) {
        pvVar7 = JavascriptNumber::ToVar((double)((ulong)(double)uVar9 | (ulong)DAT_00e0c4f0));
        return pvVar7;
      }
      pvVar7 = (Var)((ulong)-uVar9 | 0x1000000000000);
    }
  }
  return pvVar7;
}

Assistant:

Var JavascriptString::ToInteger(int radix)
    {
        AssertMsg(radix == 0 || radix >= 2 && radix <= 36, "'radix' is invalid");
        const char16* pchStart = GetString();
        const char16* pchEnd =  pchStart + m_charLength;
        const char16 *pch = this->GetScriptContext()->GetCharClassifier()->SkipWhiteSpace(pchStart, pchEnd);
        bool isNegative = false;

        if (pch < pchEnd)
        {
            switch (*pch)
            {
            case '-':
                isNegative = true;
                // Fall through.
            case '+':
                pch++;
                break;
            }
        }

        if (0 == radix)
        {
            if (pch < pchEnd && '0' != pch[0])
            {
                radix = 10;
            }
            else if (pchEnd - pch >= 2 && ('x' == pch[1] || 'X' == pch[1]))
            {
                radix = 16;
                pch += 2;
            }
            else
            {
                 // ES5's 'parseInt' does not allow treating a string beginning with a '0' as an octal value. ES3 does not specify a
                 // behavior
                 radix = 10;
            }
        }
        else if (16 == radix)
        {
            if(pchEnd - pch >= 2 && '0' == pch[0] && ('x' == pch[1] || 'X' == pch[1]))
            {
                pch += 2;
            }
        }

        Assert(radix <= _countof(maxUintStringLengthTable));
        Assert(pchEnd >= pch);
        size_t length = pchEnd - pch;
        const char16 *const pchMin = pch;
        __analysis_assume(radix < _countof(maxUintStringLengthTable));
        if(length <= maxUintStringLengthTable[radix])
        {
            // Use uint32 as integer being parsed - much faster than BigInt
            uint32 value = 0;
            for ( ; pch < pchEnd ; pch++)
            {
                char16 ch = *pch;

                if(ch >= _countof(stringToIntegerMap) || (ch = stringToIntegerMap[ch]) >= radix)
                {
                    break;
                }
                uint32 beforeValue = value;
                value = value * radix + ch;
                AssertMsg(value >= beforeValue, "uint overflow");
            }

            if(pchMin == pch)
            {
                return GetScriptContext()->GetLibrary()->GetNaN();
            }

            if(isNegative)
            {
                // negative zero can only be represented by doubles
                if(value <= INT_MAX && value != 0)
                {
                    int32 result = -((int32)value);
                    return JavascriptNumber::ToVar(result, this->GetScriptContext());
                }
                double result = -((double)(value));
                return JavascriptNumber::New(result, this->GetScriptContext());
            }
            return JavascriptNumber::ToVar(value, this->GetScriptContext());
        }

        BigUInt bi;
        for ( ; pch < pchEnd ; pch++)
        {
            char16 ch = *pch;

            if(ch >= _countof(stringToIntegerMap) || (ch = stringToIntegerMap[ch]) >= radix)
            {
                break;
            }
            if (!bi.FMulAdd(radix, ch))
            {
                //Mimic IE8 which threw an OutOfMemory exception in this case.
                JavascriptError::ThrowOutOfMemoryError(GetScriptContext());
            }
            // If we ever have more than 32 ulongs, the result must be infinite.
            if (bi.Clu() > 32)
            {
                Var result = isNegative ?
                    GetScriptContext()->GetLibrary()->GetNegativeInfinite() :
                    GetScriptContext()->GetLibrary()->GetPositiveInfinite();
                return result;
            }
        }

        if (pchMin == pch)
        {
            return GetScriptContext()->GetLibrary()->GetNaN();
        }

        // Convert to a double.
        double result = bi.GetDbl();
        if(isNegative)
        {
            result = -result;
        }

        return Js::JavascriptNumber::ToVarIntCheck(result, GetScriptContext());
    }